

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cpp
# Opt level: O2

void argo::unparser::unparse(int fd,json *j,char *space,char *newline,char *indent,int indent_inc)

{
  fd_writer w;
  unparser u;
  fd_writer fStack_68;
  unparser local_58;
  
  fd_writer::fd_writer(&fStack_68,fd);
  local_58.m_writer = &fStack_68.super_writer;
  local_58.m_space = space;
  local_58.m_newline = newline;
  local_58.m_indent = indent;
  local_58.m_indent_inc = indent_inc;
  unparse(&local_58,j,0);
  return;
}

Assistant:

void unparser::unparse(
        int        fd,
        const json &j,
        const char *space,
        const char *newline,
        const char *indent,
        int        indent_inc)
{
    fd_writer w(fd);
    unparser u(w, space, newline, indent, indent_inc);
    u.unparse(j, 0);
}